

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountOverJoin.cpp
# Opt level: O2

void __thiscall
CountOverJoin::valueCount(CountOverJoin *this,Union *factorisationNode,DTreeNode *dTreeNode)

{
  uint uVar1;
  DTreeNode *dTreeNode_00;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  DTreeNode **ppDVar7;
  ulong uVar8;
  
  if (dTreeNode->_caching == true) {
    if (this->cachedCounts[factorisationNode->cacheIndex] != 0) {
      return;
    }
    this->cachedCounts[factorisationNode->cacheIndex] = 1;
  }
  uVar2 = factorisationNode->numberOfValues;
  this->numberOfValues = this->numberOfValues + uVar2;
  uVar1 = dTreeNode->_numOfChildren;
  lVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (uVar8 = 0; uVar3 = uVar6, lVar4 = lVar5, ppDVar7 = &dTreeNode->_firstChild, uVar8 < uVar2;
      uVar8 = uVar8 + 1) {
    while (uVar3 != 0) {
      dTreeNode_00 = *ppDVar7;
      valueCount(this,*(Union **)((long)factorisationNode->children + lVar4),dTreeNode_00);
      uVar3 = uVar3 - 1;
      lVar4 = lVar4 + 8;
      ppDVar7 = &dTreeNode_00->_next;
    }
    uVar2 = factorisationNode->numberOfValues;
    lVar5 = lVar5 + (long)(int)uVar1 * 8;
  }
  return;
}

Assistant:

void CountOverJoin::valueCount(node::Union* factorisationNode, DTreeNode* dTreeNode)
{
    if (dTreeNode->_caching)
    {
        if (cachedCounts[factorisationNode->cacheIndex] > 0)
            return;

        cachedCounts[factorisationNode->cacheIndex] = 1;
    }

    numberOfValues += factorisationNode->numberOfValues;

    int numOfChildren = dTreeNode -> _numOfChildren;
    for (unsigned long val = 0; val < factorisationNode->numberOfValues; ++val)
    {
        DTreeNode* child = dTreeNode->_firstChild; 
        for (int i = 0; i < numOfChildren; ++i)
        {
            valueCount(factorisationNode->children[val * numOfChildren + i], child);
            child = child->_next;
        }
    }
}